

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SelectPopWith(Walker *pWalker,Select *p)

{
  Parse *pPVar1;
  Select *in_RAX;
  Select *pSVar2;
  
  pPVar1 = pWalker->pParse;
  if ((pPVar1->pWith != (With *)0x0) && (p->pPrior == (Select *)0x0)) {
    pSVar2 = findRightmost(in_RAX);
    if (pSVar2->pWith != (With *)0x0) {
      pPVar1->pWith = pSVar2->pWith->pOuter;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPopWith(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  if( OK_IF_ALWAYS_TRUE(pParse->pWith) && p->pPrior==0 ){
    With *pWith = findRightmost(p)->pWith;
    if( pWith!=0 ){
      assert( pParse->pWith==pWith || pParse->nErr );
      pParse->pWith = pWith->pOuter;
    }
  }
}